

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::storage_base::drop_table_internal
          (storage_base *this,string *tableName,sqlite3 *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"DROP TABLE \'",0xc);
  paVar1 = &local_1d0.field_2;
  pcVar2 = (tableName->_M_dataplus)._M_p;
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar2,pcVar2 + tableName->_M_string_length);
  std::__cxx11::string::append((char *)&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  perform_query_without_result(this,&local_1d0,db);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void drop_table_internal(const std::string &tableName, sqlite3 *db) {
        std::stringstream ss;
        ss << "DROP TABLE '" << tableName + "'";
        this->perform_query_without_result(ss.str(), db);
    }